

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
tinyusdz::crate::CrateReader::GetSpecString_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CrateReader *this,Index index)

{
  ulong uVar1;
  uint __val;
  pointer pSVar2;
  long lVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  long *plVar10;
  SpecType ty;
  uint uVar11;
  ulong uVar12;
  ulong *puVar13;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> pathv;
  string __str;
  string path_str;
  string specty_str;
  long *local_160;
  undefined8 local_158;
  long local_150;
  undefined8 uStack_148;
  ulong *local_140;
  long local_138;
  ulong local_130;
  long lStack_128;
  char local_120;
  anon_struct_8_0_00000001_for___align local_118;
  size_type local_110;
  long local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  ulong *local_f8;
  uint local_f0;
  undefined4 uStack_ec;
  ulong local_e8 [2];
  ulong *local_d8;
  undefined8 local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  undefined1 local_98 [24];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = (ulong)index.value;
  pSVar2 = (this->_specs).
           super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar12 = ((long)(this->_specs).
                  super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 2) *
           -0x5555555555555555;
  if (uVar12 < uVar1 || uVar12 - uVar1 == 0) {
LAB_001b7bb9:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    return __return_storage_ptr__;
  }
  GetPathString_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_98,this,(Index)pSVar2[uVar1].path_index.value);
  local_120 = local_98[0];
  if (local_98[0] != true) goto LAB_001b7bb9;
  local_118 = (anon_struct_8_0_00000001_for___align)&local_108;
  if ((undefined1 *)local_98._8_8_ == local_80) {
    uStack_100 = local_80._8_4_;
    uStack_fc = local_80._12_4_;
  }
  else {
    local_118 = (anon_struct_8_0_00000001_for___align)local_98._8_8_;
  }
  local_108 = CONCAT44(local_80._4_4_,local_80._0_4_);
  local_110 = local_98._16_8_;
  local_98._0_8_ = local_98 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,local_118,local_98._16_8_ + (long)local_118);
  tinyusdz::to_string_abi_cxx11_(&local_70,(tinyusdz *)(ulong)pSVar2[uVar1].spec_type,ty);
  ::std::operator+(&local_50,"[Spec] path: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_50);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_130 = *puVar9;
    lStack_128 = plVar7[3];
    local_140 = &local_130;
  }
  else {
    local_130 = *puVar9;
    local_140 = (ulong *)*plVar7;
  }
  local_138 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  __val = pSVar2[uVar1].fieldset_index.value;
  cVar6 = '\x01';
  if (9 < __val) {
    uVar11 = __val;
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      if (uVar11 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_001b7ce3;
      }
      if (uVar11 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_001b7ce3;
      }
      if (uVar11 < 10000) goto LAB_001b7ce3;
      bVar4 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (bVar4);
    cVar6 = cVar6 + '\x01';
  }
LAB_001b7ce3:
  local_f8 = local_e8;
  ::std::__cxx11::string::_M_construct((ulong)&local_f8,cVar6);
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_f8,local_f0,__val);
  uVar1 = CONCAT44(uStack_ec,local_f0) + local_138;
  uVar12 = 0xf;
  if (local_140 != &local_130) {
    uVar12 = local_130;
  }
  if (uVar12 < uVar1) {
    uVar12 = 0xf;
    if (local_f8 != local_e8) {
      uVar12 = local_e8[0];
    }
    if (uVar1 <= uVar12) {
      puVar8 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_140);
      goto LAB_001b7d6b;
    }
  }
  puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_f8);
LAB_001b7d6b:
  local_160 = &local_150;
  plVar7 = puVar8 + 2;
  if ((long *)*puVar8 == plVar7) {
    local_150 = *plVar7;
    uStack_148 = puVar8[3];
  }
  else {
    local_150 = *plVar7;
    local_160 = (long *)*puVar8;
  }
  local_158 = puVar8[1];
  *puVar8 = plVar7;
  puVar8[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)::std::__cxx11::string::append((char *)&local_160);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_a8 = *plVar10;
    lStack_a0 = plVar7[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar10;
    local_b8 = (long *)*plVar7;
  }
  local_b0 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)::std::__cxx11::string::_M_append
                             ((char *)&local_b8,(ulong)local_70._M_dataplus._M_p);
  local_d8 = &local_c8;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_c8 = *puVar9;
    lStack_c0 = plVar7[3];
    puVar13 = local_d8;
  }
  else {
    local_c8 = *puVar9;
    puVar13 = (ulong *)*plVar7;
  }
  lVar3 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  __return_storage_ptr__->has_value_ = true;
  puVar9 = (ulong *)((long)&__return_storage_ptr__->contained + 0x10);
  *(ulong **)&__return_storage_ptr__->contained = puVar9;
  if (puVar13 == local_d8) {
    *puVar9 = local_c8;
    *(long *)((long)&__return_storage_ptr__->contained + 0x18) = lStack_c0;
  }
  else {
    *(ulong **)&__return_storage_ptr__->contained = puVar13;
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x10) = local_c8;
  }
  *(long *)((long)&__return_storage_ptr__->contained + 8) = lVar3;
  local_d0 = 0;
  local_c8 = local_c8 & 0xffffffffffffff00;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,local_150 + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if (local_120 != '\x01') {
    return __return_storage_ptr__;
  }
  if (local_118 == (anon_struct_8_0_00000001_for___align)&local_108) {
    return __return_storage_ptr__;
  }
  operator_delete((void *)local_118,local_108 + 1);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<std::string> CrateReader::GetSpecString(
    crate::Index index) const {
  if (index.value < _specs.size()) {
    // ok
  } else {
    return nonstd::nullopt;
  }

  const crate::Spec &spec = _specs[index.value];

  if (auto pathv = GetPathString(spec.path_index)) {
    std::string path_str = pathv.value();
    std::string specty_str = to_string(spec.spec_type);

    return "[Spec] path: " + path_str +
           ", fieldset id: " + std::to_string(spec.fieldset_index.value) +
           ", spec_type: " + specty_str;
  }

  return nonstd::nullopt;
}